

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  char *Str;
  char *Str_00;
  raw_ostream *prVar2;
  raw_string_ostream outStream;
  raw_string_ostream local_50;
  
  iVar1 = sqlite3_errcode(*(undefined8 *)((long)this + 0x30));
  Str = (char *)sqlite3_errmsg(*(undefined8 *)((long)this + 0x30));
  Str_00 = (char *)sqlite3_db_filename(*(undefined8 *)((long)this + 0x30),"main");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50.super_raw_ostream.BufferMode = InternalBuffer;
  local_50.super_raw_ostream.OutBufStart = (char *)0x0;
  local_50.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_50.super_raw_ostream.OutBufCur = (char *)0x0;
  local_50.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_001f5230;
  local_50.OS = __return_storage_ptr__;
  prVar2 = llvm::raw_ostream::operator<<
                     (&local_50.super_raw_ostream,"error: accessing build database \"");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_00);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"\": ");
  llvm::raw_ostream::operator<<(prVar2,Str);
  if (iVar1 - 5U < 2) {
    llvm::raw_ostream::operator<<
              (&local_50.super_raw_ostream,
               " Possibly there are two concurrent builds running in the same filesystem location.")
    ;
  }
  llvm::raw_ostream::flush(&local_50.super_raw_ostream);
  llvm::raw_string_ostream::~raw_string_ostream(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string getCurrentErrorMessage() {
    int err_code = sqlite3_errcode(db);
    const char* err_message = sqlite3_errmsg(db);
    const char* filename = sqlite3_db_filename(db, "main");

    std::string out;
    llvm::raw_string_ostream outStream(out);
    outStream << "error: accessing build database \"" << filename << "\": " << err_message;

    if (err_code == SQLITE_BUSY || err_code == SQLITE_LOCKED) {
      outStream << " Possibly there are two concurrent builds running in the same filesystem location.";
    }

    outStream.flush();
    return out;
  }